

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::initRhoAvg(NavierStokesBase *this,Real alpha)

{
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  long lVar1;
  MultiFab *this_01;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (((this->super_AmrLevel).state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start)->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01 = &this->rho_avg;
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&this_01->super_FabArray<amrex::FArrayBox>,1e+200);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)this_01,true);
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::tilebox(&local_12c,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&this_01->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,
               (FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi,3);
    lVar1 = (long)local_12c.smallend.vect[1];
    lVar5 = (long)local_12c.smallend.vect[2];
    lVar8 = (lVar1 - local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar5 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_12c.smallend.vect[0] * 8
            + (long)local_d0.begin.x * -8 + (long)local_d0.p;
    lVar2 = (lVar1 - local_110.begin.y) * local_110.jstride * 8 +
            (lVar5 - local_110.begin.z) * local_110.kstride * 8 +
            (long)local_12c.smallend.vect[0] * 8 + (long)local_110.begin.x * -8 + (long)local_110.p;
    for (; lVar4 = lVar1, lVar6 = lVar8, lVar7 = lVar2, lVar5 <= local_12c.bigend.vect[2];
        lVar5 = lVar5 + 1) {
      for (; lVar4 <= local_12c.bigend.vect[1]; lVar4 = lVar4 + 1) {
        if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
          lVar3 = 0;
          do {
            *(double *)(lVar6 + lVar3 * 8) = *(double *)(lVar7 + lVar3 * 8) * alpha;
            lVar3 = lVar3 + 1;
          } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar3);
        }
        lVar6 = lVar6 + local_d0.jstride * 8;
        lVar7 = lVar7 + local_110.jstride * 8;
      }
      lVar8 = lVar8 + local_d0.kstride * 8;
      lVar2 = lVar2 + local_110.kstride * 8;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
NavierStokesBase::initRhoAvg (Real alpha)
{
    const MultiFab& S_new = get_new_data(State_Type);

    // Set to a ridiculous number just for debugging -- shouldn't need this otherwise
    rho_avg.setVal(1.e200);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rho_avg,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
       const Box& bx = mfi.tilebox();
       auto const& rhoavg     = rho_avg.array(mfi);
       auto const& rho_new    = S_new.array(mfi,Density);
       amrex::ParallelFor(bx, [rhoavg,rho_new,alpha]
       AMREX_GPU_DEVICE(int i, int j, int k) noexcept
       {
          rhoavg(i,j,k) = rho_new(i,j,k) * alpha;
       });
    }
}